

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.h
# Opt level: O2

void bitset_print(bitset_t *b)

{
  size_t sVar1;
  _Bool _Var2;
  size_t local_28;
  
  putchar(0x7b);
  local_28 = 0;
  while( true ) {
    _Var2 = bitset_next_set_bit(b,&local_28);
    sVar1 = local_28;
    if (!_Var2) break;
    printf("%zu, ",local_28);
    local_28 = sVar1 + 1;
  }
  putchar(0x7d);
  return;
}

Assistant:

inline void bitset_print(const bitset_t *b) {
    printf("{");
    for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
        printf("%zu, ", i);
    }
    printf("}");
}